

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cc
# Opt level: O0

Renderer * __thiscall
SDL2pp::Renderer::FillCopy
          (Renderer *this,Texture *texture,Optional<Rect> *srcrect,Optional<Rect> *dstrect,
          Point *offset,int flip)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  value_type *pvVar4;
  optional<SDL2pp::Rect> local_fc;
  optional<SDL2pp::Rect> local_e8;
  optional<SDL2pp::Point> local_d0;
  optional<SDL2pp::Rect> local_c4;
  optional<SDL2pp::Rect> local_b0;
  int local_9c;
  int local_98;
  int yoverflow;
  int xoverflow;
  int yunderflow;
  int xunderflow;
  Rect tile_dst;
  Rect tile_src;
  int x;
  int y;
  Rect start_tile;
  Rect dst;
  Rect src;
  int flip_local;
  Point *offset_local;
  Optional<Rect> *dstrect_local;
  Optional<Rect> *srcrect_local;
  Texture *texture_local;
  Renderer *this_local;
  
  bVar1 = sdl2pp_libcpp_optional::optional::operator_cast_to_bool((optional *)srcrect);
  if (bVar1) {
    pvVar4 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(srcrect);
    dst.super_SDL_Rect.w = (pvVar4->super_SDL_Rect).x;
    dst.super_SDL_Rect.h = (pvVar4->super_SDL_Rect).y;
    src.super_SDL_Rect.x = (pvVar4->super_SDL_Rect).w;
    src.super_SDL_Rect.y = (pvVar4->super_SDL_Rect).h;
  }
  else {
    iVar2 = Texture::GetWidth(texture);
    iVar3 = Texture::GetHeight(texture);
    Rect::Rect((Rect *)&dst.super_SDL_Rect.w,0,0,iVar2,iVar3);
  }
  bVar1 = sdl2pp_libcpp_optional::optional::operator_cast_to_bool((optional *)dstrect);
  if (bVar1) {
    pvVar4 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(dstrect);
    start_tile.super_SDL_Rect.w = (pvVar4->super_SDL_Rect).x;
    start_tile.super_SDL_Rect.h = (pvVar4->super_SDL_Rect).y;
    dst.super_SDL_Rect.x = (pvVar4->super_SDL_Rect).w;
    dst.super_SDL_Rect.y = (pvVar4->super_SDL_Rect).h;
  }
  else {
    iVar2 = GetOutputWidth(this);
    iVar3 = GetOutputHeight(this);
    Rect::Rect((Rect *)&start_tile.super_SDL_Rect.w,0,0,iVar2,iVar3);
  }
  iVar2 = src.super_SDL_Rect.x;
  iVar3 = src.super_SDL_Rect.y;
  Rect::Rect((Rect *)&x,(offset->super_SDL_Point).x,(offset->super_SDL_Point).y,src.super_SDL_Rect.x
             ,src.super_SDL_Rect.y);
  if (x + start_tile.super_SDL_Rect.x < 1) {
    x = (-x / start_tile.super_SDL_Rect.x) * start_tile.super_SDL_Rect.x + x;
  }
  if (0 < x) {
    x = x - ((x + start_tile.super_SDL_Rect.x + -1) / start_tile.super_SDL_Rect.x) *
            start_tile.super_SDL_Rect.x;
  }
  if (y + start_tile.super_SDL_Rect.y < 1) {
    y = (-y / start_tile.super_SDL_Rect.y) * start_tile.super_SDL_Rect.y + y;
  }
  if (0 < y) {
    y = y - ((y + start_tile.super_SDL_Rect.y + -1) / start_tile.super_SDL_Rect.y) *
            start_tile.super_SDL_Rect.y;
  }
  for (tile_src.super_SDL_Rect.h = y; tile_src.super_SDL_Rect.h < dst.super_SDL_Rect.y;
      tile_src.super_SDL_Rect.h = start_tile.super_SDL_Rect.y + tile_src.super_SDL_Rect.h) {
    for (tile_src.super_SDL_Rect.w = x; tile_src.super_SDL_Rect.w < dst.super_SDL_Rect.x;
        tile_src.super_SDL_Rect.w = start_tile.super_SDL_Rect.x + tile_src.super_SDL_Rect.w) {
      tile_dst.super_SDL_Rect.w = dst.super_SDL_Rect.w;
      tile_dst.super_SDL_Rect.h = dst.super_SDL_Rect.h;
      tile_src.super_SDL_Rect.x = src.super_SDL_Rect.x;
      tile_src.super_SDL_Rect.y = src.super_SDL_Rect.y;
      Rect::Rect((Rect *)&yunderflow,tile_src.super_SDL_Rect.w,tile_src.super_SDL_Rect.h,
                 start_tile.super_SDL_Rect.x,start_tile.super_SDL_Rect.y);
      xoverflow = -tile_src.super_SDL_Rect.w;
      if (tile_src.super_SDL_Rect.w < 0) {
        tile_src.super_SDL_Rect.y = iVar3;
        tile_src.super_SDL_Rect.x = iVar2 + tile_src.super_SDL_Rect.w;
        tile_dst.super_SDL_Rect.w = xoverflow + tile_dst.super_SDL_Rect.w;
        tile_dst.super_SDL_Rect.x = tile_dst.super_SDL_Rect.x + tile_src.super_SDL_Rect.w;
        yunderflow = xoverflow + yunderflow;
      }
      yoverflow = -tile_src.super_SDL_Rect.h;
      if (tile_src.super_SDL_Rect.h < 0) {
        tile_src.super_SDL_Rect.y = tile_src.super_SDL_Rect.y + tile_src.super_SDL_Rect.h;
        tile_dst.super_SDL_Rect.h = yoverflow + tile_dst.super_SDL_Rect.h;
        tile_dst.super_SDL_Rect.y = tile_dst.super_SDL_Rect.y + tile_src.super_SDL_Rect.h;
        xunderflow = yoverflow + xunderflow;
      }
      local_98 = (yunderflow + tile_dst.super_SDL_Rect.x) - dst.super_SDL_Rect.x;
      if (0 < local_98) {
        tile_src.super_SDL_Rect.x = tile_src.super_SDL_Rect.x - local_98;
        tile_dst.super_SDL_Rect.x = tile_dst.super_SDL_Rect.x - local_98;
      }
      local_9c = (xunderflow + tile_dst.super_SDL_Rect.y) - dst.super_SDL_Rect.y;
      if (0 < local_9c) {
        tile_src.super_SDL_Rect.y = tile_src.super_SDL_Rect.y - local_9c;
        tile_dst.super_SDL_Rect.y = tile_dst.super_SDL_Rect.y - local_9c;
      }
      yunderflow = start_tile.super_SDL_Rect.w + yunderflow;
      xunderflow = start_tile.super_SDL_Rect.h + xunderflow;
      if (flip == 0) {
        sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::optional
                  (&local_e8,(value_type *)&tile_dst.super_SDL_Rect.w);
        sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::optional
                  (&local_fc,(value_type *)&yunderflow);
        Copy(this,texture,&local_e8,&local_fc);
      }
      else {
        if ((flip & 1U) != 0) {
          tile_dst.super_SDL_Rect.w =
               (iVar2 - tile_dst.super_SDL_Rect.w) - tile_src.super_SDL_Rect.x;
        }
        if ((flip & 2U) != 0) {
          tile_dst.super_SDL_Rect.h =
               (iVar3 - tile_dst.super_SDL_Rect.h) - tile_src.super_SDL_Rect.y;
        }
        sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::optional
                  (&local_b0,(value_type *)&tile_dst.super_SDL_Rect.w);
        sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::optional
                  (&local_c4,(value_type *)&yunderflow);
        sdl2pp_libcpp_optional::optional<SDL2pp::Point>::optional(&local_d0);
        Copy(this,texture,&local_b0,&local_c4,0.0,&local_d0,flip);
      }
    }
  }
  return this;
}

Assistant:

Renderer& Renderer::FillCopy(Texture& texture, const Optional<Rect>& srcrect, const Optional<Rect>& dstrect, const Point& offset, int flip) {
	// resolve rectangles
	Rect src = srcrect ? *srcrect : Rect(0, 0, texture.GetWidth(), texture.GetHeight());
	Rect dst = dstrect ? *dstrect : Rect(0, 0, GetOutputWidth(), GetOutputHeight());

	// rectangle for single tile
	Rect start_tile(
			offset.x,
			offset.y,
			src.w,
			src.h
		);

	// ensure tile is leftmost and topmost
	if (start_tile.x + start_tile.w <= 0)
		start_tile.x += (-start_tile.x) / start_tile.w * start_tile.w;
	if (start_tile.x > 0)
		start_tile.x -= (start_tile.x + start_tile.w - 1) / start_tile.w * start_tile.w;

	if (start_tile.y + start_tile.h <= 0)
		start_tile.y += (-start_tile.y) / start_tile.h * start_tile.h;
	if (start_tile.y > 0)
		start_tile.y -= (start_tile.y + start_tile.h - 1) / start_tile.h * start_tile.h;

	// paint tile array
	for (int y = start_tile.y; y < dst.h; y += start_tile.h) {
		for (int x = start_tile.x; x < dst.w; x += start_tile.w) {
			Rect tile_src = src;
			Rect tile_dst(x, y, start_tile.w, start_tile.h);

			// clamp with dstrect
			int xunderflow = -x;
			if (xunderflow > 0) {
				tile_src.w -= xunderflow;
				tile_src.x += xunderflow;
				tile_dst.w -= xunderflow;
				tile_dst.x += xunderflow;
			}

			int yunderflow = -y;
			if (yunderflow > 0) {
				tile_src.h -= yunderflow;
				tile_src.y += yunderflow;
				tile_dst.h -= yunderflow;
				tile_dst.y += yunderflow;
			}

			int xoverflow = tile_dst.x + tile_dst.w - dst.w;
			if (xoverflow > 0) {
				tile_src.w -= xoverflow;
				tile_dst.w -= xoverflow;
			}

			int yoverflow = tile_dst.y + tile_dst.h - dst.h;
			if (yoverflow > 0) {
				tile_src.h -= yoverflow;
				tile_dst.h -= yoverflow;
			}

			// make tile_dst absolute
			tile_dst.x += dst.x;
			tile_dst.y += dst.y;

			if (flip != 0) {
				// mirror tile_src inside src to take flipping into account
				if (flip & SDL_FLIP_HORIZONTAL)
					tile_src.x = src.w - tile_src.x - tile_src.w;

				if (flip & SDL_FLIP_VERTICAL)
					tile_src.y = src.h - tile_src.y - tile_src.h;

				Copy(texture, tile_src, tile_dst, 0.0, NullOpt, flip);
			} else {
				Copy(texture, tile_src, tile_dst);
			}
		}
	}
	return *this;
}